

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib506.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  char *local_80;
  userdata user;
  curl_slist *pcStack_68;
  int i;
  curl_slist *next_cookie;
  curl_slist *cookies;
  curl_slist *headers;
  CURLSH *share;
  CURL *curl;
  Tdata tdata;
  char *url;
  int local_20;
  CURLcode code;
  CURLSHcode scode;
  int res;
  char *URL_local;
  
  tdata.url = (char *)0x0;
  cookies = (curl_slist *)0x0;
  next_cookie = (curl_slist *)0x0;
  local_80 = "Pigs in space";
  user.text._0_4_ = 0;
  curl_mprintf("GLOBAL_INIT\n");
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    curl_mprintf("SHARE_INIT\n");
    headers = (curl_slist *)curl_share_init();
    if (headers == (curl_slist *)0x0) {
      curl_mfprintf(_stderr,"curl_share_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = CURLE_QUIC_CONNECT_ERROR|CURLE_FTP_PORT_FAILED;
    }
    else {
      curl_mprintf("CURLSHOPT_LOCKFUNC\n");
      local_20 = curl_share_setopt(headers,3,my_lock);
      if (local_20 == 0) {
        curl_mprintf("CURLSHOPT_UNLOCKFUNC\n");
        local_20 = curl_share_setopt(headers,4,my_unlock);
      }
      if (local_20 == 0) {
        curl_mprintf("CURLSHOPT_USERDATA\n");
        local_20 = curl_share_setopt(headers,5,&local_80);
      }
      if (local_20 == 0) {
        curl_mprintf("CURL_LOCK_DATA_COOKIE\n");
        local_20 = curl_share_setopt(headers,1,2);
      }
      if (local_20 == 0) {
        curl_mprintf("CURL_LOCK_DATA_DNS\n");
        local_20 = curl_share_setopt(headers,1,3);
      }
      if (local_20 == 0) {
        share = (CURLSH *)curl_easy_init();
        if (share == (CURLSH *)0x0) {
          curl_mfprintf(_stderr,"curl_easy_init() failed\n");
          curl_share_cleanup(headers);
          curl_global_cleanup();
          URL_local._4_4_ = CURLE_QUIC_CONNECT_ERROR|CURLE_FTP_PORT_FAILED;
        }
        else {
          curl_mprintf("CURLOPT_SHARE\n");
          code = curl_easy_setopt(share,0x2774,headers);
          if (code == CURLE_OK) {
            curl_mprintf("CURLOPT_COOKIELIST injected_and_clobbered\n");
            code = curl_easy_setopt(share,0x2797,
                                    "Set-Cookie: injected_and_clobbered=yes; domain=host.foo.com; expires=Sat Feb 2 11:56:27 GMT 2030"
                                   );
            if (code == CURLE_OK) {
              curl_mprintf("CURLOPT_COOKIELIST ALL\n");
              code = curl_easy_setopt(share,0x2797,"ALL");
              if (code == CURLE_OK) {
                curl_mprintf("CURLOPT_COOKIELIST session\n");
                code = curl_easy_setopt(share,0x2797,"Set-Cookie: session=elephants");
                if (code == CURLE_OK) {
                  curl_mprintf("CURLOPT_COOKIELIST injected\n");
                  code = curl_easy_setopt(share,0x2797,
                                          "Set-Cookie: injected=yes; domain=host.foo.com; expires=Sat Feb 2 11:56:27 GMT 2030"
                                         );
                  if (code == CURLE_OK) {
                    curl_mprintf("CURLOPT_COOKIELIST SESS\n");
                    code = curl_easy_setopt(share,0x2797,"SESS");
                    if (code == CURLE_OK) {
                      curl_mprintf("CLEANUP\n");
                      curl_easy_cleanup(share);
                      for (user._12_4_ = 1; (int)user._12_4_ < 3; user._12_4_ = user._12_4_ + 1) {
                        tdata.share = (CURLSH *)suburl(URL,user._12_4_);
                        curl = (CURL *)headers;
                        curl_mprintf("*** run %d\n",user._12_4_);
                        fire(&curl);
                        curl_free(tdata.share);
                      }
                      curl_mprintf("*** run %d\n",user._12_4_);
                      share = (CURLSH *)curl_easy_init();
                      if (share == (CURLSH *)0x0) {
                        curl_mfprintf(_stderr,"curl_easy_init() failed\n");
                        curl_share_cleanup(headers);
                        curl_global_cleanup();
                        return 0x7e;
                      }
                      tdata.url = suburl(URL,user._12_4_);
                      cookies = sethost((curl_slist *)0x0);
                      code = curl_easy_setopt(share,0x2727,cookies);
                      if ((code == CURLE_OK) &&
                         (code = curl_easy_setopt(share,0x2712,tdata.url), code == CURLE_OK)) {
                        curl_mprintf("CURLOPT_SHARE\n");
                        code = curl_easy_setopt(share,0x2774,headers);
                        if (code == CURLE_OK) {
                          curl_mprintf("CURLOPT_COOKIEJAR\n");
                          code = curl_easy_setopt(share,0x2762,JAR);
                          if (code == CURLE_OK) {
                            curl_mprintf("CURLOPT_COOKIELIST FLUSH\n");
                            code = curl_easy_setopt(share,0x2797,"FLUSH");
                            if (code == CURLE_OK) {
                              curl_mprintf("PERFORM\n");
                              curl_easy_perform(share);
                              curl_mprintf("CLEANUP\n");
                              curl_easy_cleanup(share);
                              curl_free(tdata.url);
                              curl_slist_free_all(cookies);
                              share = (CURLSH *)curl_easy_init();
                              if (share == (CURLSH *)0x0) {
                                curl_mfprintf(_stderr,"curl_easy_init() failed\n");
                                curl_share_cleanup(headers);
                                curl_global_cleanup();
                                return 0x7e;
                              }
                              tdata.url = suburl(URL,user._12_4_);
                              cookies = sethost((curl_slist *)0x0);
                              code = curl_easy_setopt(share,0x2727,cookies);
                              if ((code == CURLE_OK) &&
                                 (code = curl_easy_setopt(share,0x2712,tdata.url), code == CURLE_OK)
                                 ) {
                                curl_mprintf("CURLOPT_SHARE\n");
                                code = curl_easy_setopt(share,0x2774,headers);
                                if (code == CURLE_OK) {
                                  curl_mprintf("CURLOPT_COOKIELIST ALL\n");
                                  code = curl_easy_setopt(share,0x2797,"ALL");
                                  if (code == CURLE_OK) {
                                    curl_mprintf("CURLOPT_COOKIEJAR\n");
                                    code = curl_easy_setopt(share,0x272f,JAR);
                                    if (code == CURLE_OK) {
                                      curl_mprintf("CURLOPT_COOKIELIST RELOAD\n");
                                      code = curl_easy_setopt(share,0x2797,"RELOAD");
                                      if (code == CURLE_OK) {
                                        iVar1 = curl_easy_getinfo(share,0x40001c,&next_cookie);
                                        if (iVar1 == 0) {
                                          curl_mprintf("loaded cookies:\n");
                                          if (next_cookie == (curl_slist *)0x0) {
                                            curl_mfprintf(_stderr,
                                                  "  reloading cookies from \'%s\' failed\n",JAR);
                                            code = CURLE_QUIC_CONNECT_ERROR|CURLE_FTP_PORT_FAILED;
                                          }
                                          else {
                                            curl_mprintf("-----------------\n");
                                            for (pcStack_68 = next_cookie;
                                                pcStack_68 != (curl_slist *)0x0;
                                                pcStack_68 = pcStack_68->next) {
                                              curl_mprintf("  %s\n",pcStack_68->data);
                                            }
                                            curl_mprintf("-----------------\n");
                                            curl_slist_free_all(next_cookie);
                                            curl_mprintf("try SHARE_CLEANUP...\n");
                                            iVar1 = curl_share_cleanup(headers);
                                            if (iVar1 == 0) {
                                              curl_mfprintf(_stderr,
                                                  "curl_share_cleanup succeed but error expected\n")
                                              ;
                                              headers = (curl_slist *)0x0;
                                            }
                                            else {
                                              curl_mprintf("SHARE_CLEANUP failed, correct\n");
                                            }
                                          }
                                        }
                                        else {
                                          curl_mfprintf(_stderr,"curl_easy_getinfo() failed\n");
                                          code = CURLE_QUIC_CONNECT_ERROR|CURLE_FTP_PORT_FAILED;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          curl_mprintf("CLEANUP\n");
          curl_easy_cleanup(share);
          curl_slist_free_all(cookies);
          curl_free(tdata.url);
          curl_mprintf("SHARE_CLEANUP\n");
          iVar1 = curl_share_cleanup(headers);
          if (iVar1 != 0) {
            curl_mfprintf(_stderr,"curl_share_cleanup failed, code errno %d\n",iVar1);
          }
          curl_mprintf("GLOBAL_CLEANUP\n");
          curl_global_cleanup();
          URL_local._4_4_ = code;
        }
      }
      else {
        curl_mfprintf(_stderr,"curl_share_setopt() failed\n");
        curl_share_cleanup(headers);
        curl_global_cleanup();
        URL_local._4_4_ = CURLE_QUIC_CONNECT_ERROR|CURLE_FTP_PORT_FAILED;
      }
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = CURLE_QUIC_CONNECT_ERROR|CURLE_FTP_PORT_FAILED;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res;
  CURLSHcode scode = CURLSHE_OK;
  CURLcode code = CURLE_OK;
  char *url = NULL;
  struct Tdata tdata;
  CURL *curl;
  CURLSH *share;
  struct curl_slist *headers = NULL;
  struct curl_slist *cookies = NULL;
  struct curl_slist *next_cookie = NULL;
  int i;
  struct userdata user;

  user.text = "Pigs in space";
  user.counter = 0;

  printf("GLOBAL_INIT\n");
  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* prepare share */
  printf("SHARE_INIT\n");
  share = curl_share_init();
  if(!share) {
    fprintf(stderr, "curl_share_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_LOCKFUNC\n");
    scode = curl_share_setopt(share, CURLSHOPT_LOCKFUNC, my_lock);
  }
  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_UNLOCKFUNC\n");
    scode = curl_share_setopt(share, CURLSHOPT_UNLOCKFUNC, my_unlock);
  }
  if(CURLSHE_OK == scode) {
    printf("CURLSHOPT_USERDATA\n");
    scode = curl_share_setopt(share, CURLSHOPT_USERDATA, &user);
  }
  if(CURLSHE_OK == scode) {
    printf("CURL_LOCK_DATA_COOKIE\n");
    scode = curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
  }
  if(CURLSHE_OK == scode) {
    printf("CURL_LOCK_DATA_DNS\n");
    scode = curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
  }

  if(CURLSHE_OK != scode) {
    fprintf(stderr, "curl_share_setopt() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* initial cookie manipulation */
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  printf("CURLOPT_SHARE\n");
  test_setopt(curl, CURLOPT_SHARE,      share);
  printf("CURLOPT_COOKIELIST injected_and_clobbered\n");
  test_setopt(curl, CURLOPT_COOKIELIST,
               "Set-Cookie: injected_and_clobbered=yes; "
               "domain=host.foo.com; expires=Sat Feb 2 11:56:27 GMT 2030");
  printf("CURLOPT_COOKIELIST ALL\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "ALL");
  printf("CURLOPT_COOKIELIST session\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "Set-Cookie: session=elephants");
  printf("CURLOPT_COOKIELIST injected\n");
  test_setopt(curl, CURLOPT_COOKIELIST,
               "Set-Cookie: injected=yes; domain=host.foo.com; "
               "expires=Sat Feb 2 11:56:27 GMT 2030");
  printf("CURLOPT_COOKIELIST SESS\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "SESS");
  printf("CLEANUP\n");
  curl_easy_cleanup(curl);


  res = 0;

  /* start treads */
  for(i = 1; i <= THREADS; i++) {

    /* set thread data */
    tdata.url   = suburl(URL, i); /* must be curl_free()d */
    tdata.share = share;

    /* simulate thread, direct call of "thread" function */
    printf("*** run %d\n",i);
    fire(&tdata);

    curl_free(tdata.url);
  }


  /* fetch a another one and save cookies */
  printf("*** run %d\n", i);
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  url = suburl(URL, i);
  headers = sethost(NULL);
  test_setopt(curl, CURLOPT_HTTPHEADER, headers);
  test_setopt(curl, CURLOPT_URL,        url);
  printf("CURLOPT_SHARE\n");
  test_setopt(curl, CURLOPT_SHARE,      share);
  printf("CURLOPT_COOKIEJAR\n");
  test_setopt(curl, CURLOPT_COOKIEJAR,  JAR);
  printf("CURLOPT_COOKIELIST FLUSH\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "FLUSH");

  printf("PERFORM\n");
  curl_easy_perform(curl);

  printf("CLEANUP\n");
  curl_easy_cleanup(curl);
  curl_free(url);
  curl_slist_free_all(headers);

  /* load cookies */
  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_share_cleanup(share);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  url = suburl(URL, i);
  headers = sethost(NULL);
  test_setopt(curl, CURLOPT_HTTPHEADER, headers);
  test_setopt(curl, CURLOPT_URL,        url);
  printf("CURLOPT_SHARE\n");
  test_setopt(curl, CURLOPT_SHARE,      share);
  printf("CURLOPT_COOKIELIST ALL\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "ALL");
  printf("CURLOPT_COOKIEJAR\n");
  test_setopt(curl, CURLOPT_COOKIEFILE, JAR);
  printf("CURLOPT_COOKIELIST RELOAD\n");
  test_setopt(curl, CURLOPT_COOKIELIST, "RELOAD");

  code = curl_easy_getinfo(curl, CURLINFO_COOKIELIST, &cookies);
  if(code != CURLE_OK) {
    fprintf(stderr, "curl_easy_getinfo() failed\n");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  printf("loaded cookies:\n");
  if(!cookies) {
    fprintf(stderr, "  reloading cookies from '%s' failed\n", JAR);
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  printf("-----------------\n");
  next_cookie = cookies;
  while(next_cookie) {
    printf("  %s\n", next_cookie->data);
    next_cookie = next_cookie->next;
  }
  printf("-----------------\n");
  curl_slist_free_all(cookies);

  /* try to free share, expect to fail because share is in use*/
  printf("try SHARE_CLEANUP...\n");
  scode = curl_share_cleanup(share);
  if(scode == CURLSHE_OK) {
    fprintf(stderr, "curl_share_cleanup succeed but error expected\n");
    share = NULL;
  }
  else {
    printf("SHARE_CLEANUP failed, correct\n");
  }

test_cleanup:

  /* clean up last handle */
  printf("CLEANUP\n");
  curl_easy_cleanup(curl);
  curl_slist_free_all(headers);
  curl_free(url);

  /* free share */
  printf("SHARE_CLEANUP\n");
  scode = curl_share_cleanup(share);
  if(scode != CURLSHE_OK)
    fprintf(stderr, "curl_share_cleanup failed, code errno %d\n",
            (int)scode);

  printf("GLOBAL_CLEANUP\n");
  curl_global_cleanup();

  return res;
}